

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::Texture2DRenderCase::init(Texture2DRenderCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TestLog *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mat3 *mtx;
  float *pfVar5;
  MessageBuilder *pMVar6;
  ostream *poVar7;
  char *pcVar8;
  Texture2D *this_01;
  Texture2D *pTVar9;
  PixelBufferAccess *access;
  int *piVar10;
  EVP_PKEY_CTX *ctx_00;
  bool bVar11;
  Enum<int,_2UL> EVar12;
  int local_1168;
  bool local_eb2;
  bool local_eb1;
  Vector<float,_4> local_ea0;
  Vector<float,_4> local_e90;
  int local_e80;
  int local_e7c;
  int levelNdx;
  int numLevels;
  Texture2D *texture;
  IVec4 *sw;
  string local_e60 [4];
  int texNdx_2;
  int local_e40;
  int local_e3c;
  int texNdx_1;
  int texNdx;
  ostringstream fragSrc;
  char *local_b40;
  MessageBuilder local_b38;
  GetNameFunc local_9b8;
  int local_9b0;
  Enum<int,_2UL> local_9a8;
  GetNameFunc local_998;
  int local_990;
  Enum<int,_2UL> local_988;
  MessageBuilder local_978;
  GetNameFunc local_7f8;
  int local_7f0;
  Enum<int,_2UL> local_7e8;
  GetNameFunc local_7d8;
  int local_7d0;
  Enum<int,_2UL> local_7c8;
  MessageBuilder local_7b8;
  MessageBuilder local_638;
  char *local_4b8;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  Vector<float,_4> local_1a0;
  Vector<float,_4> local_190;
  Vector<float,_4> local_180;
  Vector<float,_4> local_170;
  AttribSpec local_160;
  Vector<float,_3> local_100;
  tcu local_f4 [12];
  undefined1 local_e8 [8];
  Vec2 p11;
  tcu local_d4 [12];
  undefined1 local_c8 [8];
  Vec2 p01;
  tcu local_b4 [12];
  undefined1 local_a8 [8];
  Vec2 p10;
  tcu local_94 [12];
  undefined1 local_88 [8];
  Vec2 p00;
  int iStack_78;
  bool mipmaps;
  int height;
  int width;
  float fStack_6c;
  bool isIntUint;
  DataType local_68;
  Precision local_64;
  DataType samplerType;
  Precision samplerPrec;
  TextureFormatInfo fmtInfo;
  TextureFormat texFormat;
  TestLog *log;
  Texture2DRenderCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx);
  fmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&samplerType,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  bVar11 = true;
  if ((fmtInfo.lookupBias.m_data[3] != 4.90454e-44) &&
     (bVar11 = true, fmtInfo.lookupBias.m_data[3] != 4.62428e-44)) {
    bVar11 = fmtInfo.lookupBias.m_data[3] == 4.06377e-44;
  }
  local_64 = PRECISION_MEDIUMP;
  if (bVar11) {
    local_64 = PRECISION_HIGHP;
  }
  width = (int)fmtInfo.lookupBias.m_data[2];
  fStack_6c = fmtInfo.lookupBias.m_data[3];
  local_68 = glu::getSampler2DType((TextureFormat)fmtInfo.lookupBias.m_data._8_8_);
  local_eb1 = local_68 == TYPE_INT_SAMPLER_2D || local_68 == TYPE_UINT_SAMPLER_2D;
  height._3_1_ = local_eb1;
  iVar4 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  iStack_78 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  p00.m_data[1] =
       (float)tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar4));
  if ((this->m_powerOfTwo & 1U) != 0) {
    iStack_78 = roundDownToPowerOfTwo(iStack_78);
    p00.m_data[1] = (float)roundDownToPowerOfTwo((int)p00.m_data[1]);
  }
  local_eb2 = true;
  if (((this->m_minFilter != 0x2700) && (local_eb2 = true, this->m_minFilter != 0x2702)) &&
     (local_eb2 = true, this->m_minFilter != 0x2701)) {
    local_eb2 = this->m_minFilter == 0x2703;
  }
  p00.m_data[0]._3_1_ = local_eb2;
  mtx = &this->m_coordTransform;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&p10,0.0,0.0,1.0);
  tcu::operator*(local_94,mtx,(Vector<float,_3> *)&p10);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_88,(int)local_94,0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&p01,1.0,0.0,1.0);
  tcu::operator*(local_b4,mtx,(Vector<float,_3> *)&p01);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_a8,(int)local_b4,0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&p11,0.0,1.0,1.0);
  tcu::operator*(local_d4,mtx,(Vector<float,_3> *)&p11);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_c8,(int)local_d4,0);
  tcu::Vector<float,_3>::Vector(&local_100,1.0,1.0,1.0);
  tcu::operator*(local_f4,mtx,&local_100);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_e8,(int)local_f4,0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_88);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_88);
  tcu::Vector<float,_4>::Vector(&local_170,fVar1,*pfVar5,0.0,0.0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_a8);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_a8);
  tcu::Vector<float,_4>::Vector(&local_180,fVar1,*pfVar5,0.0,0.0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_c8);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_c8);
  tcu::Vector<float,_4>::Vector(&local_190,fVar1,*pfVar5,0.0,0.0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_e8);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_e8);
  tcu::Vector<float,_4>::Vector(&local_1a0,fVar1,*pfVar5,0.0,0.0);
  deqp::gls::AttribSpec::AttribSpec
            (&local_160,"a_coords",&local_170,&local_180,&local_190,&local_1a0);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
            (&(this->super_ShaderPerformanceCase).m_attributes,&local_160);
  deqp::gls::AttribSpec::~AttribSpec(&local_160);
  tcu::TestLog::operator<<(&local_330,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [7])0x2c60e44);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xffffffffffffff88);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a8224a);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)(p00.m_data + 1));
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_330);
  tcu::TestLog::operator<<(&local_4b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_4b0,(char (*) [9])0x29a5d4e);
  local_4b8 = glu::getTextureFormatName(this->m_internalFormat);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4b8);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4b0);
  tcu::TestLog::operator<<(&local_638,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_638,(char (*) [9])"Coords: ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_88);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_a8);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_c8);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_e8);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_638);
  tcu::TestLog::operator<<(&local_7b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_7b8,(char (*) [7])"Wrap: ");
  EVar12 = glu::getTextureWrapModeStr(this->m_wrapS);
  local_7d8 = EVar12.m_getName;
  local_7d0 = EVar12.m_value;
  local_7c8.m_getName = local_7d8;
  local_7c8.m_value = local_7d0;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_7c8);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2b88b0c);
  EVar12 = glu::getTextureWrapModeStr(this->m_wrapT);
  local_7f8 = EVar12.m_getName;
  local_7f0 = EVar12.m_value;
  local_7e8.m_getName = local_7f8;
  local_7e8.m_value = local_7f0;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_7e8);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_7b8);
  tcu::TestLog::operator<<(&local_978,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_978,(char (*) [9])"Filter: ");
  EVar12 = glu::getTextureFilterStr(this->m_minFilter);
  local_998 = EVar12.m_getName;
  local_990 = EVar12.m_value;
  local_988.m_getName = local_998;
  local_988.m_value = local_990;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_988);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2b88b0c);
  EVar12 = glu::getTextureFilterStr(this->m_magFilter);
  local_9b8 = EVar12.m_getName;
  local_9b0 = EVar12.m_value;
  local_9a8.m_getName = local_9b8;
  local_9a8.m_value = local_9b0;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9a8);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_978);
  tcu::TestLog::operator<<(&local_b38,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_b38,(char (*) [10])"Mipmaps: ");
  local_b40 = "false";
  if ((p00.m_data[0]._3_1_ & 1) != 0) {
    local_b40 = "true";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_b40);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b38);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&fragSrc.field_0x170,this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&fragSrc.field_0x170,
                      (char (*) [25])"Using additive blending.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&fragSrc.field_0x170);
  deqp::gls::ShaderPerformanceCase::setViewportSize
            (&this->super_ShaderPerformanceCase,iStack_78,(int)p00.m_data[1]);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_vertShaderSource,
             "#version 300 es\nin highp vec4 a_position;\nin mediump vec2 a_coords;\nout mediump vec2 v_coords;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coords = a_coords;\n}\n"
            );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&texNdx_1);
  std::operator<<((ostream *)&texNdx_1,"#version 300 es\n");
  std::operator<<((ostream *)&texNdx_1,"layout(location = 0) out mediump vec4 o_color;\n");
  std::operator<<((ostream *)&texNdx_1,"in mediump vec2 v_coords;\n");
  for (local_e3c = 0; local_e3c < this->m_numTextures; local_e3c = local_e3c + 1) {
    poVar7 = std::operator<<((ostream *)&texNdx_1,"uniform ");
    pcVar8 = glu::getPrecisionName(local_64);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7," ");
    pcVar8 = glu::getDataTypeName(local_68);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7," u_sampler");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_e3c);
    std::operator<<(poVar7,";\n");
  }
  poVar7 = std::operator<<((ostream *)&texNdx_1,"void main (void)\n");
  std::operator<<(poVar7,"{\n");
  for (local_e40 = 0; local_e40 < this->m_numTextures; local_e40 = local_e40 + 1) {
    if (local_e40 == 0) {
      poVar7 = std::operator<<((ostream *)&texNdx_1,"\t");
      pcVar8 = glu::getPrecisionName(local_64);
      poVar7 = std::operator<<(poVar7,pcVar8);
      std::operator<<(poVar7," vec4 r = ");
    }
    else {
      std::operator<<((ostream *)&texNdx_1,"\tr += ");
    }
    if ((height._3_1_ & 1) != 0) {
      std::operator<<((ostream *)&texNdx_1,"vec4(");
    }
    poVar7 = std::operator<<((ostream *)&texNdx_1,"texture(u_sampler");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_e40);
    std::operator<<(poVar7,", v_coords)");
    if ((height._3_1_ & 1) != 0) {
      std::operator<<((ostream *)&texNdx_1,")");
    }
    std::operator<<((ostream *)&texNdx_1,";\n");
  }
  poVar7 = std::operator<<((ostream *)&texNdx_1,"\to_color = r;\n");
  std::operator<<(poVar7,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_fragShaderSource,local_e60);
  std::__cxx11::string::~string(local_e60);
  ctx_00 = (EVP_PKEY_CTX *)(long)this->m_numTextures;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            (&this->m_textures,(size_type)ctx_00);
  for (sw._4_4_ = 0; sw._4_4_ < this->m_numTextures; sw._4_4_ = sw._4_4_ + 1) {
    if ((init()::swizzles == '\0') && (iVar4 = __cxa_guard_acquire(&init()::swizzles), iVar4 != 0))
    {
      tcu::Vector<int,_4>::Vector(init::swizzles,0,1,2,3);
      tcu::Vector<int,_4>::Vector(init::swizzles + 1,1,2,3,0);
      tcu::Vector<int,_4>::Vector(init::swizzles + 2,2,3,0,1);
      tcu::Vector<int,_4>::Vector(init::swizzles + 3,3,0,1,2);
      tcu::Vector<int,_4>::Vector(init::swizzles + 4,3,2,1,0);
      tcu::Vector<int,_4>::Vector(init::swizzles + 5,2,1,0,3);
      tcu::Vector<int,_4>::Vector(init::swizzles + 6,1,0,3,2);
      tcu::Vector<int,_4>::Vector(init::swizzles + 7,0,3,2,1);
      __cxa_guard_release(&init()::swizzles);
    }
    texture = (Texture2D *)(init::swizzles + sw._4_4_ % 8);
    this_01 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_01,(this->super_ShaderPerformanceCase).m_renderCtx,this->m_internalFormat,
               iStack_78,(int)p00.m_data[1]);
    ctx_00 = (EVP_PKEY_CTX *)&levelNdx;
    _levelNdx = this_01;
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
              (&this->m_textures,(value_type *)ctx_00);
    if ((p00.m_data[0]._3_1_ & 1) == 0) {
      local_1168 = 1;
    }
    else {
      pTVar9 = glu::Texture2D::getRefTexture(_levelNdx);
      local_1168 = tcu::TextureLevelPyramid::getNumLevels(&pTVar9->super_TextureLevelPyramid);
    }
    local_e7c = local_1168;
    for (local_e80 = 0; local_e80 < local_e7c; local_e80 = local_e80 + 1) {
      pTVar9 = glu::Texture2D::getRefTexture(_levelNdx);
      tcu::Texture2D::allocLevel(pTVar9,local_e80);
      pTVar9 = glu::Texture2D::getRefTexture(_levelNdx);
      access = tcu::TextureLevelPyramid::getLevel(&pTVar9->super_TextureLevelPyramid,local_e80);
      piVar10 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,0);
      iVar4 = *piVar10;
      piVar10 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,1);
      iVar2 = *piVar10;
      piVar10 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,2);
      iVar3 = *piVar10;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,3);
      tcu::Vector<float,_4>::swizzle(&local_e90,(int)&samplerType,iVar4,iVar2,iVar3);
      piVar10 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,0);
      iVar4 = *piVar10;
      piVar10 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,1);
      iVar2 = *piVar10;
      piVar10 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,2);
      iVar3 = *piVar10;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,3);
      tcu::Vector<float,_4>::swizzle(&local_ea0,(int)&fmtInfo + 8,iVar4,iVar2,iVar3);
      ctx_00 = (EVP_PKEY_CTX *)&local_e90;
      tcu::fillWithComponentGradients(access,(Vec4 *)ctx_00,&local_ea0);
    }
    (*_levelNdx->_vptr_Texture2D[2])();
  }
  deqp::gls::ShaderPerformanceCase::init(&this->super_ShaderPerformanceCase,ctx_00);
  iVar4 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&texNdx_1);
  return iVar4;
}

Assistant:

void Texture2DRenderCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	const tcu::TextureFormat		texFormat	= glu::mapGLInternalFormat(m_internalFormat);
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFormat);
	const glu::Precision			samplerPrec	= (texFormat.type == tcu::TextureFormat::FLOAT			||
												   texFormat.type == tcu::TextureFormat::UNSIGNED_INT32	||
												   texFormat.type == tcu::TextureFormat::SIGNED_INT32)
												? glu::PRECISION_HIGHP : glu::PRECISION_MEDIUMP;
	const glu::DataType				samplerType	= glu::getSampler2DType(texFormat);
	const bool						isIntUint	= samplerType == glu::TYPE_INT_SAMPLER_2D || samplerType == glu::TYPE_UINT_SAMPLER_2D;

	int								width		= m_renderCtx.getRenderTarget().getWidth();
	int								height		= m_renderCtx.getRenderTarget().getHeight();

	if (m_powerOfTwo)
	{
		width	= roundDownToPowerOfTwo(width);
		height	= roundDownToPowerOfTwo(height);
	}

	bool mipmaps = m_minFilter == GL_NEAREST_MIPMAP_NEAREST ||
				   m_minFilter == GL_NEAREST_MIPMAP_LINEAR	||
				   m_minFilter == GL_LINEAR_MIPMAP_NEAREST	||
				   m_minFilter == GL_LINEAR_MIPMAP_LINEAR;

	DE_ASSERT(m_powerOfTwo || (!mipmaps && m_wrapS == GL_CLAMP_TO_EDGE && m_wrapT == GL_CLAMP_TO_EDGE));

	Vec2 p00 = (m_coordTransform * Vec3(0.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p10 = (m_coordTransform * Vec3(1.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p01 = (m_coordTransform * Vec3(0.0f, 1.0f, 1.0f)).swizzle(0,1);
	Vec2 p11 = (m_coordTransform * Vec3(1.0f, 1.0f, 1.0f)).swizzle(0,1);

	m_attributes.push_back(AttribSpec("a_coords", Vec4(p00.x(), p00.y(), 0.0f, 0.0f),
												  Vec4(p10.x(), p10.y(), 0.0f, 0.0f),
												  Vec4(p01.x(), p01.y(), 0.0f, 0.0f),
												  Vec4(p11.x(), p11.y(), 0.0f, 0.0f)));

	log << TestLog::Message << "Size: " << width << "x" << height << TestLog::EndMessage;
	log << TestLog::Message << "Format: " <<glu::getTextureFormatName(m_internalFormat) << TestLog::EndMessage;
	log << TestLog::Message << "Coords: " << p00 << ", " << p10 << ", " << p01 << ", " << p11 << TestLog::EndMessage;
	log << TestLog::Message << "Wrap: " << glu::getTextureWrapModeStr(m_wrapS) << " / " << glu::getTextureWrapModeStr(m_wrapT) << TestLog::EndMessage;
	log << TestLog::Message << "Filter: " << glu::getTextureFilterStr(m_minFilter) << " / " << glu::getTextureFilterStr(m_magFilter) << TestLog::EndMessage;
	log << TestLog::Message << "Mipmaps: " << (mipmaps ? "true" : "false") << TestLog::EndMessage;
	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;

	// Use same viewport size as texture size.
	setViewportSize(width, height);

	m_vertShaderSource =
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in mediump vec2 a_coords;\n"
		"out mediump vec2 v_coords;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";

	std::ostringstream fragSrc;
	fragSrc << "#version 300 es\n";
	fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
	fragSrc << "in mediump vec2 v_coords;\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "uniform " << glu::getPrecisionName(samplerPrec) << " " << glu::getDataTypeName(samplerType) << " u_sampler" << texNdx << ";\n";

	fragSrc << "void main (void)\n"
			<< "{\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		if (texNdx == 0)
			fragSrc << "\t" << glu::getPrecisionName(samplerPrec) << " vec4 r = ";
		else
			fragSrc << "\tr += ";

		if (isIntUint)
			fragSrc << "vec4(";

		fragSrc << "texture(u_sampler" << texNdx << ", v_coords)";

		if (isIntUint)
			fragSrc << ")";

		fragSrc << ";\n";
	}

	fragSrc << "	o_color = r;\n"
			<< "}\n";

	m_fragShaderSource = fragSrc.str();

	m_textures.reserve(m_numTextures);
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		static const IVec4 swizzles[] = { IVec4(0,1,2,3), IVec4(1,2,3,0), IVec4(2,3,0,1), IVec4(3,0,1,2),
										  IVec4(3,2,1,0), IVec4(2,1,0,3), IVec4(1,0,3,2), IVec4(0,3,2,1) };
		const IVec4& sw = swizzles[texNdx % DE_LENGTH_OF_ARRAY(swizzles)];

		glu::Texture2D* texture = new glu::Texture2D(m_renderCtx, m_internalFormat, width, height);
		m_textures.push_back(texture);

		// Fill levels.
		int numLevels = mipmaps ? texture->getRefTexture().getNumLevels() : 1;
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			// \todo [2013-06-02 pyry] Values are not scaled back to 0..1 range in shaders.
			texture->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(texture->getRefTexture().getLevel(levelNdx),
											fmtInfo.valueMin.swizzle(sw[0], sw[1], sw[2], sw[3]),
											fmtInfo.valueMax.swizzle(sw[0], sw[1], sw[2], sw[3]));
		}

		texture->upload();
	}

	ShaderPerformanceCase::init();
}